

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.c
# Opt level: O3

int av1_lookahead_push(lookahead_ctx *ctx,YV12_BUFFER_CONFIG *src,int64_t ts_start,int64_t ts_end,
                      int use_highbitdepth,_Bool alloc_pyramid,aom_enc_frame_flags_t flags)

{
  lookahead_entry *ybf;
  int iVar1;
  int iVar2;
  int height;
  int iVar3;
  int ss_x;
  int ss_y;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  YV12_BUFFER_CONFIG new_img;
  
  iVar4 = ctx->max_sz;
  iVar1 = ctx->read_ctxs[0].sz;
  iVar6 = 1;
  if ((int)((uint)ctx->max_pre_frames + iVar1) <= iVar4) {
    iVar6 = (src->field_2).field_0.y_crop_width;
    iVar2 = (src->field_2).field_0.uv_crop_width;
    height = (src->field_3).field_0.y_crop_height;
    iVar3 = (src->field_3).field_0.uv_crop_height;
    ss_x = src->subsampling_x;
    ss_y = src->subsampling_y;
    ctx->read_ctxs[0].sz = iVar1 + 1;
    if (ctx->read_ctxs[1].valid != 0) {
      ctx->read_ctxs[1].sz = ctx->read_ctxs[1].sz + 1;
    }
    iVar1 = ctx->write_idx;
    iVar5 = 0;
    if (iVar4 <= iVar1 + 1) {
      iVar5 = iVar4;
    }
    ybf = ctx->buf + iVar1;
    ctx->write_idx = (iVar1 + 1) - iVar5;
    iVar4 = ctx->buf[iVar1].img.field_2.field_0.y_crop_width;
    bVar7 = true;
    if (((iVar6 == iVar4) &&
        (height == (((anon_union_8_2_abde48f3_for_yv12_buffer_config_6 *)(&(ybf->img).field_0 + 3))
                   ->field_0).y_crop_height)) &&
       (iVar2 == *(int *)((long)&(ybf->img).field_0 + 0x14))) {
      bVar7 = iVar3 != *(int *)((long)&(ybf->img).field_0 + 0x1c);
    }
    if (((iVar4 < iVar6) ||
        ((((anon_union_8_2_abde48f3_for_yv12_buffer_config_6 *)(&(ybf->img).field_0 + 3))->field_0).
         y_crop_height < height)) ||
       ((*(int *)((long)&(ybf->img).field_0 + 0x14) < iVar2 ||
        (*(int *)((long)&(ybf->img).field_0 + 0x1c) < iVar3)))) {
      memset(&new_img,0,0xd0);
      iVar4 = aom_alloc_frame_buffer
                        (&new_img,iVar6,height,ss_x,ss_y,use_highbitdepth,0x120,0,alloc_pyramid,0);
      if (iVar4 != 0) {
        return 1;
      }
      aom_free_frame_buffer(&ybf->img);
      memcpy(ybf,&new_img,0xd0);
    }
    else if (bVar7) {
      (ybf->img).field_0.field_0.y_width = (src->field_0).field_0.y_width;
      (((anon_union_8_2_70c94c84_for_yv12_buffer_config_2 *)(&(ybf->img).field_0 + 1))->field_0).
      y_height = (src->field_1).field_0.y_height;
      (ybf->img).field_0.field_0.uv_width = (src->field_0).field_0.uv_width;
      *(int *)((long)&(ybf->img).field_0 + 0xc) = (src->field_1).field_0.uv_height;
      (((anon_union_8_2_5af33bd4_for_yv12_buffer_config_4 *)(&(ybf->img).field_0 + 2))->field_0).
      y_crop_width = (src->field_2).field_0.y_crop_width;
      (((anon_union_8_2_abde48f3_for_yv12_buffer_config_6 *)(&(ybf->img).field_0 + 3))->field_0).
      y_crop_height = (src->field_3).field_0.y_crop_height;
      *(int *)((long)&(ybf->img).field_0 + 0x14) = (src->field_2).field_0.uv_crop_width;
      *(int *)((long)&(ybf->img).field_0 + 0x1c) = (src->field_3).field_0.uv_crop_height;
      (&(ybf->img).field_0)[0x12] =
           (anon_union_8_2_2fc10223_for_yv12_buffer_config_0)*(undefined8 *)&src->subsampling_x;
    }
    av1_copy_and_extend_frame(src,&ybf->img);
    ybf->ts_start = ts_start;
    ybf->ts_end = ts_end;
    iVar4 = ctx->push_frame_count;
    ybf->display_idx = iVar4;
    ybf->flags = flags;
    ctx->push_frame_count = iVar4 + 1;
    aom_remove_metadata_from_frame_buffer(&ybf->img);
    if ((src->metadata != (aom_metadata_array_t *)0x0) &&
       (iVar4 = aom_copy_metadata_to_frame_buffer(&ybf->img,src->metadata), iVar4 != 0)) {
      return 1;
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int av1_lookahead_push(struct lookahead_ctx *ctx, const YV12_BUFFER_CONFIG *src,
                       int64_t ts_start, int64_t ts_end, int use_highbitdepth,
                       bool alloc_pyramid, aom_enc_frame_flags_t flags) {
  int width = src->y_crop_width;
  int height = src->y_crop_height;
  int uv_width = src->uv_crop_width;
  int uv_height = src->uv_crop_height;
  int subsampling_x = src->subsampling_x;
  int subsampling_y = src->subsampling_y;
  int larger_dimensions, new_dimensions;

  assert(ctx->read_ctxs[ENCODE_STAGE].valid == 1);
  if (ctx->read_ctxs[ENCODE_STAGE].sz + ctx->max_pre_frames > ctx->max_sz)
    return 1;

  ctx->read_ctxs[ENCODE_STAGE].sz++;
  if (ctx->read_ctxs[LAP_STAGE].valid) {
    ctx->read_ctxs[LAP_STAGE].sz++;
  }

  struct lookahead_entry *buf = pop(ctx, &ctx->write_idx);

  new_dimensions = width != buf->img.y_crop_width ||
                   height != buf->img.y_crop_height ||
                   uv_width != buf->img.uv_crop_width ||
                   uv_height != buf->img.uv_crop_height;
  larger_dimensions =
      width > buf->img.y_crop_width || height > buf->img.y_crop_height ||
      uv_width > buf->img.uv_crop_width || uv_height > buf->img.uv_crop_height;
  assert(!larger_dimensions || new_dimensions);

  if (larger_dimensions) {
    YV12_BUFFER_CONFIG new_img;
    memset(&new_img, 0, sizeof(new_img));
    if (aom_alloc_frame_buffer(&new_img, width, height, subsampling_x,
                               subsampling_y, use_highbitdepth,
                               AOM_BORDER_IN_PIXELS, 0, alloc_pyramid, 0))
      return 1;
    aom_free_frame_buffer(&buf->img);
    buf->img = new_img;
  } else if (new_dimensions) {
    buf->img.y_width = src->y_width;
    buf->img.y_height = src->y_height;
    buf->img.uv_width = src->uv_width;
    buf->img.uv_height = src->uv_height;
    buf->img.y_crop_width = src->y_crop_width;
    buf->img.y_crop_height = src->y_crop_height;
    buf->img.uv_crop_width = src->uv_crop_width;
    buf->img.uv_crop_height = src->uv_crop_height;
    buf->img.subsampling_x = src->subsampling_x;
    buf->img.subsampling_y = src->subsampling_y;
  }
  av1_copy_and_extend_frame(src, &buf->img);

  buf->ts_start = ts_start;
  buf->ts_end = ts_end;
  buf->display_idx = ctx->push_frame_count;
  buf->flags = flags;
  ++ctx->push_frame_count;
  aom_remove_metadata_from_frame_buffer(&buf->img);
  if (src->metadata &&
      aom_copy_metadata_to_frame_buffer(&buf->img, src->metadata)) {
    return 1;
  }
  return 0;
}